

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_loop_expand.cpp
# Opt level: O1

void optimization::loop_expand::expand_loop(MirFunction *func,BasicBlk *blk,loop_info *info)

{
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *this;
  iterator __position;
  int *__k;
  pointer *ppuVar1;
  uint32_t uVar2;
  int iVar3;
  Inst *pIVar4;
  VarId *pVVar5;
  undefined8 uVar6;
  _Base_ptr p_Var7;
  char cVar8;
  int iVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  long *plVar11;
  long lVar12;
  mapped_type *pmVar13;
  mapped_type *pmVar14;
  size_type sVar15;
  __normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
  _Var16;
  uint32_t *puVar17;
  pointer puVar18;
  char *pcVar19;
  Tag *pTVar20;
  pointer *__ptr;
  pointer puVar21;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *this_00;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  pointer puVar22;
  PhiInst *this_01;
  VarId *__x;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar23;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>,_std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  pVar24;
  VarId new_change_var;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  insts;
  size_type __dnew_1;
  Rewriter rwt;
  size_type __dnew;
  ostream local_1b1;
  undefined1 local_1b0 [8];
  _Base_ptr local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_190;
  undefined8 local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  loop_info *local_170;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  local_168;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> auStack_150 [2];
  undefined1 local_140;
  mapped_type *local_138;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *local_130;
  undefined1 local_128 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  _Alloc_hider local_100;
  _func_int **local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  size_t local_e0;
  bool local_d8;
  undefined1 local_d0 [16];
  undefined1 local_c0 [8];
  undefined1 local_b8 [16];
  _Alloc_hider local_a8;
  _Base_ptr local_a0;
  undefined **local_98;
  undefined **ppuStack_90;
  size_t local_88;
  Displayable local_80;
  Op local_78;
  undefined **local_70;
  uint32_t local_68;
  int local_60;
  code *local_58;
  MirFunction *local_50;
  _Base_ptr local_48;
  undefined8 local_40;
  undefined1 local_38;
  
  local_170 = info;
  local_138 = std::
              map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
              ::at(&func->basic_blks,&info->loop_start);
  local_1b1 = (ostream)0x0;
  AixLog::operator<<(&local_1b1,(Severity *)info);
  local_128._8_8_ = &local_110;
  local_128._0_8_ = &PTR__Tag_001edee0;
  local_128._16_8_ = (_Base_ptr)0x0;
  local_110._M_allocated_capacity = local_110._M_allocated_capacity & 0xffffffffffffff00;
  local_100._M_p._0_1_ = 1;
  AixLog::operator<<((ostream *)local_128,(Tag *)info);
  local_130 = &func->basic_blks;
  local_50 = func;
  local_188 = std::chrono::_V2::system_clock::now();
  local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&PTR__Timestamp_001edeb0;
  local_180._M_allocated_capacity = local_180._M_allocated_capacity & 0xffffffffffffff00;
  AixLog::operator<<((ostream *)&local_190,(Timestamp *)info);
  ppuVar1 = &local_168.
             super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_168.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0x65;
  local_168.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_6_ = 0x5f646e617078;
  local_168.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0x6c;
  auStack_150[0]._M_t.super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
  _M_t.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
  super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl._0_1_ = 0x6f;
  auStack_150[0]._M_t.super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
  _M_t.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
  super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl._1_2_ = 0x706f;
  local_168.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xb;
  auStack_150[0]._M_t.super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
  _M_t.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
  super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl._3_1_ = 0;
  local_48 = (_Base_ptr)0x6d;
  local_1b0 = (undefined1  [8])&local_1a0;
  local_168.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar1;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)std::__cxx11::string::_M_create((ulong *)local_1b0,(ulong)&local_48);
  p_Var7 = local_48;
  local_1a0._M_local_buf[0] = (char)local_48;
  local_1a0._M_allocated_capacity._1_6_ = (undefined6)((ulong)local_48 >> 8);
  local_1a0._M_local_buf[7] = (char)((ulong)local_48 >> 0x38);
  pcVar19 = 
  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/const_loop_expand.cpp"
  ;
  local_1b0 = (undefined1  [8])paVar10;
  memcpy(paVar10,
         "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/const_loop_expand.cpp"
         ,0x6d);
  paVar10->_M_local_buf[(long)p_Var7] = '\0';
  local_d0._8_8_ = local_b8;
  local_d0._0_8_ = &PTR__Function_001edf10;
  if (local_168.
      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start == (pointer)ppuVar1) {
    local_b8._8_8_ =
         CONCAT44(auStack_150[0]._M_t.
                  super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t
                  .super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                  super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl._4_4_,
                  CONCAT13(auStack_150[0]._M_t.
                           super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                           .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl._3_1_,
                           CONCAT21(auStack_150[0]._M_t.
                                    super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                    .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl.
                                    _1_2_,auStack_150[0]._M_t.
                                          super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                          .super__Head_base<0UL,_mir::inst::Inst_*,_false>.
                                          _M_head_impl._0_1_)));
  }
  else {
    local_d0._8_8_ =
         local_168.
         super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  local_b8._1_6_ =
       local_168.
       super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._1_6_;
  local_b8[0] = local_168.
                super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_;
  local_b8[7] = local_168.
                super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_;
  local_c0 = (undefined1  [8])
             local_168.
             super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_168.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  if (local_1b0 == (undefined1  [8])&local_1a0) {
    ppuStack_90 = (undefined **)
                  CONCAT44(local_1a0._12_4_,CONCAT13(local_1a0._M_local_buf[0xb],local_1a0._8_3_));
    local_a8._M_p = (pointer)&local_98;
  }
  else {
    local_a8._M_p = (pointer)local_1b0;
  }
  local_98 = (undefined **)
             CONCAT17(local_1a0._M_local_buf[7],
                      CONCAT61(local_1a0._M_allocated_capacity._1_6_,local_1a0._M_local_buf[0]));
  local_a0 = p_Var7;
  local_1a8 = (_Base_ptr)0x0;
  local_1a0._M_local_buf[0] = '\0';
  local_88 = 0x148;
  local_80._vptr_Displayable = local_80._vptr_Displayable & 0xffffffffffffff00;
  local_1b0 = (undefined1  [8])&local_1a0;
  local_168.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar1;
  AixLog::operator<<((ostream *)local_d0,(Function *)pcVar19);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"expand loop starts at  ",0x17);
  plVar11 = (long *)std::ostream::operator<<(&std::clog,local_170->loop_start);
  cVar8 = std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
  pTVar20 = (Tag *)(ulong)(uint)(int)cVar8;
  std::ostream::put((char)plVar11);
  std::ostream::flush();
  AixLog::Function::~Function((Function *)local_d0);
  if (local_1b0 != (undefined1  [8])&local_1a0) {
    pTVar20 = (Tag *)(CONCAT17(local_1a0._M_local_buf[7],
                               CONCAT61(local_1a0._M_allocated_capacity._1_6_,
                                        local_1a0._M_local_buf[0])) + 1);
    operator_delete((void *)local_1b0,(ulong)pTVar20);
  }
  if (local_168.
      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppuVar1) {
    pTVar20 = (Tag *)(CONCAT17(local_168.
                               super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_,
                               CONCAT61(local_168.
                                        super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage._1_6_,
                                        local_168.
                                        super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_)) +
                     1);
    operator_delete(local_168.
                    super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,(ulong)pTVar20);
  }
  local_128._0_8_ = &PTR__Tag_001edee0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._8_8_ != &local_110) {
    pTVar20 = (Tag *)(local_110._M_allocated_capacity + 1);
    operator_delete((void *)local_128._8_8_,(ulong)pTVar20);
  }
  local_1b1 = (ostream)0x0;
  AixLog::operator<<(&local_1b1,(Severity *)pTVar20);
  local_168.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__Tag_001edee0;
  local_168.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_168.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_6_ = 0;
  local_168.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  auStack_150[0]._M_t.super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
  _M_t.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
  super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl._0_1_ = 0;
  local_140 = 1;
  local_168.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = auStack_150;
  AixLog::operator<<((ostream *)&local_168,pTVar20);
  local_40 = std::chrono::_V2::system_clock::now();
  local_48 = (_Base_ptr)&PTR__Timestamp_001edeb0;
  local_38 = 0;
  AixLog::operator<<((ostream *)&local_48,(Timestamp *)pTVar20);
  local_1a0._M_local_buf[0] = 'e';
  local_1a0._M_allocated_capacity._1_6_ = 0x5f646e617078;
  local_1a0._7_4_ = 0x706f6f6c;
  local_1a8 = (_Base_ptr)0xb;
  local_1a0._M_local_buf[0xb] = '\0';
  local_190 = &local_180;
  local_128._0_8_ = (_func_int **)0x6d;
  local_1b0 = (undefined1  [8])&local_1a0;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)std::__cxx11::string::_M_create((ulong *)&local_190,(ulong)local_128);
  uVar6 = local_128._0_8_;
  local_180._M_allocated_capacity = local_128._0_8_;
  pcVar19 = 
  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/const_loop_expand.cpp"
  ;
  local_190 = paVar10;
  memcpy(paVar10,
         "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/const_loop_expand.cpp"
         ,0x6d);
  paVar10->_M_local_buf[uVar6] = '\0';
  local_d0._0_8_ = &PTR__Function_001edf10;
  local_d0._8_8_ = local_b8;
  if (local_1b0 == (undefined1  [8])&local_1a0) {
    local_b8._8_8_ =
         CONCAT44(local_1a0._12_4_,CONCAT13(local_1a0._M_local_buf[0xb],local_1a0._8_3_));
  }
  else {
    local_d0._8_8_ = local_1b0;
  }
  local_b8._1_6_ = local_1a0._M_allocated_capacity._1_6_;
  local_b8[0] = local_1a0._M_local_buf[0];
  local_b8[7] = local_1a0._M_local_buf[7];
  local_c0 = (undefined1  [8])local_1a8;
  local_1a8 = (_Base_ptr)0x0;
  local_1a0._M_local_buf[0] = '\0';
  if (local_190 == &local_180) {
    ppuStack_90 = (undefined **)local_180._8_8_;
    local_a8._M_p = (pointer)&local_98;
  }
  else {
    local_a8._M_p = (pointer)local_190;
  }
  local_98 = (undefined **)local_180._M_allocated_capacity;
  local_a0 = (_Base_ptr)uVar6;
  local_188 = 0;
  local_180._M_allocated_capacity = local_180._M_allocated_capacity & 0xffffffffffffff00;
  local_88 = 0x149;
  local_80._vptr_Displayable = local_80._vptr_Displayable & 0xffffffffffffff00;
  local_1b0 = (undefined1  [8])&local_1a0;
  local_190 = &local_180;
  AixLog::operator<<((ostream *)local_d0,(Function *)pcVar19);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"init_val: ",10);
  local_128._8_8_ = &PTR_display_001ee058;
  local_128._16_4_ = (local_170->init_var).first.id;
  local_128._0_8_ = &PTR_display_001f0018;
  local_110._8_4_ = (local_170->init_var).second;
  local_110._M_allocated_capacity = (size_type)&PTR_display_001effc8;
  local_f8 = (_func_int **)CONCAT53(local_f8._3_5_,0x100);
  mir::inst::AssignInst::display((AssignInst *)local_128,(ostream *)&std::clog);
  cVar8 = std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
  pTVar20 = (Tag *)(ulong)(uint)(int)cVar8;
  std::ostream::put(-0x80);
  std::ostream::flush();
  AixLog::Function::~Function((Function *)local_d0);
  if (local_190 != &local_180) {
    pTVar20 = (Tag *)(local_180._M_allocated_capacity + 1);
    operator_delete(local_190,(ulong)pTVar20);
  }
  if (local_1b0 != (undefined1  [8])&local_1a0) {
    pTVar20 = (Tag *)(CONCAT17(local_1a0._M_local_buf[7],
                               CONCAT61(local_1a0._M_allocated_capacity._1_6_,
                                        local_1a0._M_local_buf[0])) + 1);
    operator_delete((void *)local_1b0,(ulong)pTVar20);
  }
  local_168.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__Tag_001edee0;
  if (local_168.
      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != auStack_150) {
    pTVar20 = (Tag *)(CONCAT44(auStack_150[0]._M_t.
                               super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                               .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl._4_4_,
                               CONCAT13(auStack_150[0]._M_t.
                                        super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                        .super__Head_base<0UL,_mir::inst::Inst_*,_false>.
                                        _M_head_impl._3_1_,
                                        CONCAT21(auStack_150[0]._M_t.
                                                 super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                                 .super__Head_base<0UL,_mir::inst::Inst_*,_false>.
                                                 _M_head_impl._1_2_,
                                                 auStack_150[0]._M_t.
                                                 super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                                 .super__Head_base<0UL,_mir::inst::Inst_*,_false>.
                                                 _M_head_impl._0_1_))) + 1);
    operator_delete(local_168.
                    super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,(ulong)pTVar20);
  }
  local_1b1 = (ostream)0x0;
  AixLog::operator<<(&local_1b1,(Severity *)pTVar20);
  local_168.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__Tag_001edee0;
  local_168.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_168.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_6_ = 0;
  local_168.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  auStack_150[0]._M_t.super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
  _M_t.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
  super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl._0_1_ = 0;
  local_140 = 1;
  local_168.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = auStack_150;
  AixLog::operator<<((ostream *)&local_168,pTVar20);
  local_40 = std::chrono::_V2::system_clock::now();
  local_48 = (_Base_ptr)&PTR__Timestamp_001edeb0;
  local_38 = 0;
  AixLog::operator<<((ostream *)&local_48,(Timestamp *)pTVar20);
  local_1a0._M_local_buf[0] = 'e';
  local_1a0._M_allocated_capacity._1_6_ = 0x5f646e617078;
  local_1a0._7_4_ = 0x706f6f6c;
  local_1a8 = (_Base_ptr)0xb;
  local_1a0._M_local_buf[0xb] = '\0';
  local_190 = &local_180;
  local_d0._0_8_ = (_func_int **)0x6d;
  local_1b0 = (undefined1  [8])&local_1a0;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)std::__cxx11::string::_M_create((ulong *)&local_190,(ulong)local_d0);
  uVar6 = local_d0._0_8_;
  local_180._M_allocated_capacity = local_d0._0_8_;
  pcVar19 = 
  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/const_loop_expand.cpp"
  ;
  local_190 = paVar10;
  memcpy(paVar10,
         "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/const_loop_expand.cpp"
         ,0x6d);
  paVar10->_M_local_buf[uVar6] = '\0';
  local_128._0_8_ = &PTR__Function_001edf10;
  local_128._8_8_ = &local_110;
  if (local_1b0 == (undefined1  [8])&local_1a0) {
    local_110._8_8_ =
         CONCAT44(local_1a0._12_4_,CONCAT13(local_1a0._M_local_buf[0xb],local_1a0._8_3_));
  }
  else {
    local_128._8_8_ = local_1b0;
  }
  local_110._M_allocated_capacity._1_6_ = local_1a0._M_allocated_capacity._1_6_;
  local_110._M_local_buf[0] = local_1a0._M_local_buf[0];
  local_110._M_local_buf[7] = local_1a0._M_local_buf[7];
  local_100._M_p = (pointer)&local_f0;
  local_128._16_8_ = local_1a8;
  local_1a8 = (_Base_ptr)0x0;
  local_1a0._M_local_buf[0] = '\0';
  if (local_190 == &local_180) {
    local_f0._8_8_ = local_180._8_8_;
  }
  else {
    local_100._M_p = (pointer)local_190;
  }
  local_f0._M_allocated_capacity = local_180._M_allocated_capacity;
  local_f8 = (_func_int **)uVar6;
  local_188 = 0;
  local_180._M_allocated_capacity = local_180._M_allocated_capacity & 0xffffffffffffff00;
  local_e0 = 0x14c;
  local_d8 = false;
  local_1b0 = (undefined1  [8])&local_1a0;
  local_190 = &local_180;
  AixLog::operator<<((ostream *)local_128,(Function *)pcVar19);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"change : ",9);
  uVar2 = (local_170->init_var).first.id;
  local_78 = local_170->change_op;
  local_d0._8_8_ = &PTR_display_001ee058;
  local_c0._0_4_ = uVar2;
  local_d0._0_8_ = &PTR_display_001f0078;
  local_b8._8_8_ = &PTR_display_001ee058;
  local_a8._M_p._0_4_ = uVar2;
  local_b8._0_8_ = &PTR_display_001effc8;
  local_a0 = (_Base_ptr)CONCAT53(local_a0._3_5_,0x101);
  ppuStack_90 = (undefined **)CONCAT44(ppuStack_90._4_4_,local_170->change_value);
  local_98 = &PTR_display_001effc8;
  local_80._vptr_Displayable._0_3_ = 0x100;
  local_58 = mir::inst::OpInst::display;
  mir::inst::OpInst::display((OpInst *)local_d0,(ostream *)&std::clog);
  cVar8 = std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
  pTVar20 = (Tag *)(ulong)(uint)(int)cVar8;
  std::ostream::put(-0x80);
  std::ostream::flush();
  AixLog::Function::~Function((Function *)local_128);
  if (local_190 != &local_180) {
    pTVar20 = (Tag *)(local_180._M_allocated_capacity + 1);
    operator_delete(local_190,(ulong)pTVar20);
  }
  if (local_1b0 != (undefined1  [8])&local_1a0) {
    pTVar20 = (Tag *)(CONCAT17(local_1a0._M_local_buf[7],
                               CONCAT61(local_1a0._M_allocated_capacity._1_6_,
                                        local_1a0._M_local_buf[0])) + 1);
    operator_delete((void *)local_1b0,(ulong)pTVar20);
  }
  local_168.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__Tag_001edee0;
  if (local_168.
      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != auStack_150) {
    pTVar20 = (Tag *)(CONCAT44(auStack_150[0]._M_t.
                               super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                               .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl._4_4_,
                               CONCAT13(auStack_150[0]._M_t.
                                        super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                        .super__Head_base<0UL,_mir::inst::Inst_*,_false>.
                                        _M_head_impl._3_1_,
                                        CONCAT21(auStack_150[0]._M_t.
                                                 super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                                 .super__Head_base<0UL,_mir::inst::Inst_*,_false>.
                                                 _M_head_impl._1_2_,
                                                 auStack_150[0]._M_t.
                                                 super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                                 .super__Head_base<0UL,_mir::inst::Inst_*,_false>.
                                                 _M_head_impl._0_1_))) + 1);
    operator_delete(local_168.
                    super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,(ulong)pTVar20);
  }
  local_1b1 = (ostream)0x0;
  AixLog::operator<<(&local_1b1,(Severity *)pTVar20);
  local_168.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__Tag_001edee0;
  local_168.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_168.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_6_ = 0;
  local_168.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  auStack_150[0]._M_t.super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
  _M_t.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
  super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl._0_1_ = 0;
  local_140 = 1;
  local_168.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = auStack_150;
  AixLog::operator<<((ostream *)&local_168,pTVar20);
  local_40 = std::chrono::_V2::system_clock::now();
  local_48 = (_Base_ptr)&PTR__Timestamp_001edeb0;
  local_38 = 0;
  AixLog::operator<<((ostream *)&local_48,(Timestamp *)pTVar20);
  local_1a0._M_local_buf[0] = 'e';
  local_1a0._M_allocated_capacity._1_6_ = 0x5f646e617078;
  local_1a0._7_4_ = 0x706f6f6c;
  local_1a8 = (_Base_ptr)0xb;
  local_1a0._M_local_buf[0xb] = '\0';
  local_190 = &local_180;
  local_d0._0_8_ = (_func_int **)0x6d;
  local_1b0 = (undefined1  [8])&local_1a0;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)std::__cxx11::string::_M_create((ulong *)&local_190,(ulong)local_d0);
  uVar6 = local_d0._0_8_;
  local_180._M_allocated_capacity = local_d0._0_8_;
  pcVar19 = 
  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/const_loop_expand.cpp"
  ;
  local_190 = paVar10;
  memcpy(paVar10,
         "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/const_loop_expand.cpp"
         ,0x6d);
  paVar10->_M_local_buf[uVar6] = '\0';
  local_128._0_8_ = &PTR__Function_001edf10;
  local_128._8_8_ = &local_110;
  if (local_1b0 == (undefined1  [8])&local_1a0) {
    local_110._8_8_ =
         CONCAT44(local_1a0._12_4_,CONCAT13(local_1a0._M_local_buf[0xb],local_1a0._8_3_));
  }
  else {
    local_128._8_8_ = local_1b0;
  }
  local_110._M_allocated_capacity._1_6_ = local_1a0._M_allocated_capacity._1_6_;
  local_110._M_local_buf[0] = local_1a0._M_local_buf[0];
  local_110._M_local_buf[7] = local_1a0._M_local_buf[7];
  local_128._16_8_ = local_1a8;
  local_1a8 = (_Base_ptr)0x0;
  local_1a0._M_local_buf[0] = '\0';
  local_100._M_p = (pointer)&local_f0;
  if (local_190 == &local_180) {
    local_f0._8_8_ = local_180._8_8_;
  }
  else {
    local_100._M_p = (pointer)local_190;
  }
  local_f0._M_allocated_capacity = local_180._M_allocated_capacity;
  local_f8 = (_func_int **)uVar6;
  local_188 = 0;
  local_180._M_allocated_capacity = local_180._M_allocated_capacity & 0xffffffffffffff00;
  local_e0 = 0x150;
  local_d8 = false;
  local_1b0 = (undefined1  [8])&local_1a0;
  local_190 = &local_180;
  AixLog::operator<<((ostream *)local_128,(Function *)pcVar19);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"continue when: ",0xf);
  local_78 = local_170->in_op;
  local_d0._8_8_ = &PTR_display_001ee058;
  local_c0 = (undefined1  [8])((ulong)local_c0 & 0xffffffff00000000);
  local_d0._0_8_ = &PTR_display_001f0078;
  local_b8._8_8_ = &PTR_display_001ee058;
  local_a8._M_p._0_4_ = (local_170->init_var).first.id;
  local_b8._0_8_ = &PTR_display_001effc8;
  local_a0 = (_Base_ptr)CONCAT53(local_a0._3_5_,0x101);
  ppuStack_90 = (undefined **)CONCAT44(ppuStack_90._4_4_,local_170->in_value);
  local_98 = &PTR_display_001effc8;
  local_80._vptr_Displayable._0_3_ = 0x100;
  (*local_58)(local_d0,&std::clog);
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  AixLog::Function::~Function((Function *)local_128);
  this_00 = local_130;
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180._M_allocated_capacity + 1);
  }
  if (local_1b0 != (undefined1  [8])&local_1a0) {
    operator_delete((void *)local_1b0,
                    CONCAT17(local_1a0._M_local_buf[7],
                             CONCAT61(local_1a0._M_allocated_capacity._1_6_,
                                      local_1a0._M_local_buf[0])) + 1);
  }
  local_168.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__Tag_001edee0;
  if (local_168.
      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != auStack_150) {
    operator_delete(local_168.
                    super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
                    CONCAT44(auStack_150[0]._M_t.
                             super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                             .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl._4_4_,
                             CONCAT13(auStack_150[0]._M_t.
                                      super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                      .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl.
                                      _3_1_,CONCAT21(auStack_150[0]._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                                  .super__Head_base<0UL,_mir::inst::Inst_*,_false>.
                                                  _M_head_impl._1_2_,
                                                  auStack_150[0]._M_t.
                                                  super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                                  .super__Head_base<0UL,_mir::inst::Inst_*,_false>.
                                                  _M_head_impl._0_1_))) + 1);
  }
  local_78 = (local_170->init_var).first.id;
  local_68 = (local_170->change_var).id;
  local_d0._0_8_ = local_50;
  local_b8._0_8_ = local_b8._0_8_ & 0xffffffff00000000;
  local_b8._8_8_ = 0;
  local_98 = (undefined **)0x0;
  ppuStack_90 = &PTR_display_001ee058;
  local_88 = CONCAT44(local_88._4_4_,(local_170->phi_var).id);
  local_80._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
  local_70 = &PTR_display_001ee058;
  local_d0._8_8_ = blk;
  local_a8._M_p = (pointer)local_b8;
  local_a0 = (_Base_ptr)local_b8;
  lVar12 = std::_Rb_tree_decrement
                     (&(local_50->variables)._M_t._M_impl.super__Rb_tree_header._M_header);
  local_60 = *(int *)(lVar12 + 0x20);
  iVar9 = (blk->jump).bb_false;
  (blk->jump).kind = Br;
  if ((blk->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_engaged == true) {
    (blk->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
    super__Optional_payload_base<mir::inst::VarId>._M_engaged = false;
  }
  (blk->jump).bb_true = iVar9;
  (blk->jump).bb_false = -1;
  (blk->jump).jump_kind = Undefined;
  iVar9 = loop_info::get_times(local_170);
  local_1b0 = (undefined1  [8])&PTR_display_001ee058;
  local_1a8 = (_Base_ptr)CONCAT44(local_1a8._4_4_,0xffffffff);
  Rewriter::get_insts(&local_168,(Rewriter *)local_d0,iVar9,(VarId *)local_1b0);
  puVar18 = (blk->inst).
            super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar22 = (blk->inst).
            super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  puVar21 = puVar18;
  if (puVar22 != puVar18) {
    do {
      pIVar4 = (puVar21->_M_t).
               super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
               super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
               super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
      if (pIVar4 != (Inst *)0x0) {
        (*(pIVar4->super_Displayable)._vptr_Displayable[5])();
      }
      (puVar21->_M_t).super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
      _M_t.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
      super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl = (Inst *)0x0;
      puVar21 = puVar21 + 1;
    } while (puVar21 != puVar22);
    (blk->inst).
    super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar18;
    this_00 = local_130;
  }
  puVar18 = local_168.
            super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_168.
      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_168.
      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this = &local_138->inst;
    puVar22 = local_168.
              super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::
      vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
      ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                  *)this,puVar22);
      puVar22 = puVar22 + 1;
    } while (puVar22 != puVar18);
  }
  pmVar14 = local_138;
  pmVar13 = std::
            map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
            ::at(this_00,&(local_138->jump).bb_false);
  __k = &(pmVar14->jump).bb_true;
  pVar23 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
           equal_range(&(pmVar13->preceding)._M_t,__k);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_M_erase_aux
            (&(pmVar13->preceding)._M_t,(_Base_ptr)pVar23.first._M_node,
             (_Base_ptr)pVar23.second._M_node);
  iVar3 = (pmVar14->jump).bb_false;
  (pmVar14->jump).kind = Br;
  if ((pmVar14->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_engaged == true) {
    (pmVar14->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
    super__Optional_payload_base<mir::inst::VarId>._M_engaged = false;
  }
  (pmVar14->jump).bb_true = iVar3;
  (pmVar14->jump).bb_false = -1;
  (pmVar14->jump).jump_kind = Undefined;
  pVar24 = std::
           _Rb_tree<int,_std::pair<const_int,_mir::inst::BasicBlk>,_std::_Select1st<std::pair<const_int,_mir::inst::BasicBlk>_>,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
           ::equal_range(&this_00->_M_t,&blk->id);
  std::
  _Rb_tree<int,_std::pair<const_int,_mir::inst::BasicBlk>,_std::_Select1st<std::pair<const_int,_mir::inst::BasicBlk>_>,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar24.first._M_node,(_Base_ptr)pVar24.second._M_node);
  local_130 = (map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
               *)CONCAT44(local_130._4_4_,iVar9);
  pmVar14 = std::
            map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
            ::at(this_00,__k);
  puVar18 = (pmVar14->inst).
            super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (puVar18 !=
      (pmVar14->inst).
      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_138 = (mapped_type *)&local_170->init_var;
    __x = &local_170->change_var;
    local_170 = (loop_info *)&PTR_display_001f03d8;
    do {
      iVar9 = (*(((puVar18->_M_t).
                  super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t
                  .super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                  super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->super_Displayable).
                _vptr_Displayable[1])();
      if (iVar9 != 7) break;
      this_01 = (PhiInst *)
                (puVar18->_M_t).
                super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
      if ((loop_info *)(this_01->super_Inst).super_Displayable._vptr_Displayable != local_170) {
        this_01 = (PhiInst *)0x0;
      }
      mir::inst::PhiInst::useVars
                ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  *)local_128,this_01);
      sVar15 = std::
               set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
               ::count((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                        *)local_128,__x);
      std::
      _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
      ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                   *)local_128);
      if (sVar15 != 0) {
        _Var16 = std::
                 __find_if<__gnu_cxx::__normal_iterator<mir::inst::VarId*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,__gnu_cxx::__ops::_Iter_equals_val<mir::inst::VarId_const>>
                           (*(undefined8 *)
                             &(this_01->vars).
                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                            ,(this_01->vars).
                             super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                             ._M_impl.super__Vector_impl_data._M_finish,__x);
        pVVar5 = (this_01->vars).
                 super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if ((_Var16._M_current + 1 != pVVar5) &&
           (lVar12 = (long)pVVar5 - (long)(_Var16._M_current + 1) >> 4, 0 < lVar12)) {
          lVar12 = lVar12 + 1;
          puVar17 = &_Var16._M_current[1].id;
          do {
            puVar17[-4] = *puVar17;
            lVar12 = lVar12 + -1;
            puVar17 = puVar17 + 4;
          } while (1 < lVar12);
        }
        (this_01->vars).super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
        _M_impl.super__Vector_impl_data._M_finish = pVVar5 + -1;
      }
      if ((int)local_130 != 0) {
        mir::inst::PhiInst::useVars
                  ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                    *)local_128,this_01);
        sVar15 = std::
                 set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                 ::count((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                          *)local_128,(key_type *)local_138);
        std::
        _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
        ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                     *)local_128);
        if (sVar15 != 0) {
          _Var16 = std::
                   __find_if<__gnu_cxx::__normal_iterator<mir::inst::VarId*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,__gnu_cxx::__ops::_Iter_equals_val<mir::inst::VarId_const>>
                             (*(undefined8 *)
                               &(this_01->vars).
                                super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                              ,(this_01->vars).
                               super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                               ._M_impl.super__Vector_impl_data._M_finish,local_138);
          pVVar5 = (this_01->vars).
                   super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if ((_Var16._M_current + 1 != pVVar5) &&
             (lVar12 = (long)pVVar5 - (long)(_Var16._M_current + 1) >> 4, 0 < lVar12)) {
            lVar12 = lVar12 + 1;
            puVar17 = &_Var16._M_current[1].id;
            do {
              puVar17[-4] = *puVar17;
              lVar12 = lVar12 + -1;
              puVar17 = puVar17 + 4;
            } while (1 < lVar12);
          }
          __position._M_current = pVVar5 + -1;
          (this_01->vars).super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
          _M_impl.super__Vector_impl_data._M_finish = __position._M_current;
          if (__position._M_current ==
              (this_01->vars).
              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
            _M_realloc_insert<mir::inst::VarId_const&>
                      ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>> *)&this_01->vars,
                       __position,(VarId *)local_1b0);
          }
          else {
            pVVar5[-1].super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
            pVVar5[-1].id = (uint32_t)local_1a8;
            (this_01->vars).super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
            _M_impl.super__Vector_impl_data._M_finish = pVVar5;
          }
        }
      }
      puVar18 = puVar18 + 1;
    } while (puVar18 !=
             (pmVar14->inst).
             super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::~vector(&local_168);
  std::
  _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_std::_Select1st<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
  ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_std::_Select1st<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
               *)local_c0);
  return;
}

Assistant:

void expand_loop(mir::inst::MirFunction& func, mir::inst::BasicBlk& blk,
                 loop_info info) {
  auto& loop_start = func.basic_blks.at(info.loop_start);
  LOG(TRACE) << "expand loop starts at  " << info.loop_start << std::endl;
  LOG(TRACE) << "init_val: "
             << mir::inst::AssignInst(info.init_var.first, info.init_var.second)
             << std::endl;
  LOG(TRACE) << "change : "
             << mir::inst::OpInst(info.init_var.first, info.init_var.first,
                                  info.change_value, info.change_op)
             << std::endl;
  LOG(TRACE) << "continue when: "
             << mir::inst::OpInst(mir::inst::VarId(0), info.init_var.first,
                                  info.in_value, info.in_op)
             << std::endl;
  Rewriter rwt(func, blk, {info.phi_var, info.init_var.first}, info.change_var);
  blk.jump = mir::inst::JumpInstruction(mir::inst::JumpInstructionKind::Br,
                                        blk.jump.bb_false);
  int times = info.get_times();
  mir::inst::VarId new_change_var;
  auto insts = rwt.get_insts(times, new_change_var);
  blk.inst.clear();
  for (auto& inst : insts) {
    loop_start.inst.push_back(std::move(inst));
  }
  func.basic_blks.at(loop_start.jump.bb_false)
      .preceding.erase(loop_start.jump.bb_true);

  loop_start.jump = mir::inst::JumpInstruction(
      mir::inst::JumpInstructionKind::Br, loop_start.jump.bb_false);
  func.basic_blks.erase(blk.id);
  auto& end_loop_blk = func.basic_blks.at(loop_start.jump.bb_true);
  for (auto iter = end_loop_blk.inst.begin();
       iter != end_loop_blk.inst.end() &&
       iter->get()->inst_kind() == mir::inst::InstKind::Phi;
       iter++) {
    auto& inst = *iter;
    auto& i = *inst;
    auto phiInst = dynamic_cast<mir::inst::PhiInst*>(&i);
    if (phiInst->useVars().count(info.change_var)) {
      phiInst->vars.erase(std::find(phiInst->vars.begin(), phiInst->vars.end(),
                                    info.change_var));
    }
    if (times) {
      if (phiInst->useVars().count(info.init_var.first)) {
        phiInst->vars.erase(std::find(
            phiInst->vars.begin(), phiInst->vars.end(), info.init_var.first));
        phiInst->vars.push_back(new_change_var);
      }
    }
  }
}